

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBase::iterate
          (TestStatus *__return_storage_ptr__,MemoryQualifierInstanceBase *this)

{
  ImageType IVar1;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  ChannelType CVar6;
  int iVar7;
  VkFormat VVar8;
  VkDevice device;
  DeviceInterface *deviceInterface;
  const_iterator cVar9;
  TextureFormat *pTVar10;
  undefined8 *puVar11;
  long *plVar12;
  int i;
  long lVar13;
  TextureFormat TVar14;
  ulong *puVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ChannelOrder CVar19;
  uint x;
  MemoryQualifierInstanceBase *pMVar20;
  TestStatus *pTVar21;
  ChannelOrder y;
  ulong uVar22;
  ChannelOrder CVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  UVec3 computeGridSize_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  UVec3 computeGridSize_3;
  UVec3 computeGridSize_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  UVec3 numGroups;
  ConstPixelBufferAccess referencePixelBuffer;
  UVec3 computeGridSize;
  UVec3 computeGridSize_2;
  TextureLevel referenceImage;
  ConstPixelBufferAccess resultPixelBuffer;
  undefined1 local_430 [12];
  ChannelType CStack_424;
  long local_420;
  TextureFormat TStack_418;
  Vec4 local_408;
  ulong local_3f8;
  long lStack_3f0;
  VkQueue local_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0;
  undefined8 uStack_3c8;
  UVec3 *local_3c0;
  MemoryQualifierInstanceBase *local_3b8;
  TestContext *local_3b0;
  undefined8 local_3a8;
  TextureFormat local_3a0;
  TextureFormat local_398 [2];
  ChannelOrder local_384;
  ChannelType local_380;
  ChannelOrder local_37c;
  undefined1 local_378 [12];
  ChannelOrder CStack_36c;
  long local_368;
  TextureFormat TStack_360;
  ulong *local_358;
  long local_350;
  ulong local_348 [2];
  ulong local_338;
  uint local_330;
  ConstPixelBufferAccess local_328;
  TextureFormat local_300;
  TestStatus *local_2f8;
  TextureFormat *local_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8 [2];
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8 [2];
  int local_2a4;
  int local_2a0;
  int local_29c;
  TextureFormat local_298;
  long *plStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  TextureFormat local_278;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_270;
  TextureFormat local_258;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_250;
  TextureFormat local_238;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_230;
  TextureFormat local_218;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_210;
  ConstPixelBufferAccess local_1f8 [2];
  ios_base local_188 [264];
  TextureLevel local_80;
  ConstPixelBufferAccess local_58;
  
  local_2f8 = __return_storage_ptr__;
  device = Context::getDevice((this->super_TestInstance).m_context);
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_3e8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar3 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_3c0 = &this->m_imageSize;
  dVar4 = getNumPixels(this->m_imageType,local_3c0);
  iVar5 = tcu::getPixelSize(this->m_format);
  uVar24 = (ulong)(iVar5 * dVar4);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,uVar24);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)((this->super_TestInstance).m_context)->m_progCollection,&this->m_name);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_1f8,deviceInterface,device,
             *(ProgramBinary **)(cVar9._M_node + 2),0);
  local_218 = local_1f8[0].m_format;
  local_3b8 = this;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_1f8,deviceInterface,device,
                     (VkDescriptorSetLayout)
                     (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                     m_data.object.m_internal);
  local_278 = local_1f8[0].m_format;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)local_1f8,deviceInterface,device,
                      (VkPipelineLayout)local_1f8[0].m_format,(VkShaderModule)local_218);
  local_238 = local_1f8[0].m_format;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_1f8,deviceInterface,device,2,dVar3,
             (VkAllocationCallbacks *)0x0);
  local_258 = local_1f8[0].m_format;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_1f8,deviceInterface,device,
             (VkCommandPool)local_1f8[0].m_format,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  TVar14 = local_1f8[0].m_format;
  pMVar20 = local_3b8;
  plStack_290 = (long *)CONCAT44(local_1f8[0].m_size.m_data[1],local_1f8[0].m_size.m_data[0]);
  local_288 = CONCAT44(local_1f8[0].m_pitch.m_data[0],local_1f8[0].m_size.m_data[2]);
  uStack_280 = CONCAT44(local_1f8[0].m_pitch.m_data[2],local_1f8[0].m_pitch.m_data[1]);
  local_298 = local_1f8[0].m_format;
  beginCommandBuffer(deviceInterface,(VkCommandBuffer)local_1f8[0].m_format);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])(deviceInterface,TVar14,1,local_238);
  (*deviceInterface->_vptr_DeviceInterface[0x56])
            (deviceInterface,TVar14,1,local_278,0,1,&pMVar20->m_descriptorSet,0,0);
  (*(pMVar20->super_TestInstance)._vptr_TestInstance[5])(pMVar20,TVar14,uVar24);
  IVar1 = pMVar20->m_imageType;
  getShaderGridSize((image *)local_430,IVar1,local_3c0);
  getShaderGridSize((image *)local_1f8,IVar1,local_3c0);
  local_328.m_size.m_data[0] = 2;
  if ((uint)local_1f8[0].m_size.m_data[0] < 2) {
    local_328.m_size.m_data[0] = local_1f8[0].m_size.m_data[0];
  }
  local_2f0 = &local_3b8->m_format;
  auVar25._8_8_ = 0;
  auVar25._0_4_ = local_1f8[0].m_format.order;
  auVar25._4_4_ = local_1f8[0].m_format.type;
  uVar22 = CONCAT44(-(uint)(-0x7ffffff9 < SUB164(_DAT_00ac4b80 ^ auVar25,4)),
                    -(uint)(-0x7ffffff9 < SUB164(_DAT_00ac4b80 ^ auVar25,0)));
  local_328.m_format =
       (TextureFormat)(uVar22 & (ulong)DAT_00b3b520 | ~uVar22 & (ulong)local_1f8[0].m_format);
  local_338 = 0;
  local_330 = 0;
  lVar13 = 0;
  do {
    *(uint *)((long)&local_338 + lVar13 * 4) =
         *(uint *)(local_430 + lVar13 * 4) / (uint)local_328.m_size.m_data[lVar13 + -2];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])
            (deviceInterface,TVar14,local_338 & 0xffffffff,local_338 >> 0x20,(ulong)local_330);
  (*(local_3b8->super_TestInstance)._vptr_TestInstance[6])(local_3b8,TVar14,uVar24);
  endCommandBuffer(deviceInterface,(VkCommandBuffer)TVar14);
  submitCommandsAndWait(deviceInterface,device,local_3e8,(VkCommandBuffer)TVar14);
  pMVar20 = local_3b8;
  lVar13 = (long)(((local_3b8->m_buffer).
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (deviceInterface,device,(VkDeviceMemory)*(deUint64 *)(lVar13 + 8),
             *(VkDeviceSize *)(lVar13 + 0x10),uVar24);
  getShaderGridSize((image *)&local_2a4,pMVar20->m_imageType,local_3c0);
  pTVar10 = local_2f0;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_58,local_2f0,local_2a4,local_2a0,local_29c,*(void **)(lVar13 + 0x18));
  getShaderGridSize((image *)&local_3a8,local_3b8->m_imageType,local_3c0);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_1f8,pTVar10,(int)local_3a8,local_3a8._4_4_,local_3a0.order);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_430,(TextureLevel *)local_1f8);
  tcu::TextureLevel::TextureLevel(&local_80,pTVar10,(int)local_3a8,local_3a8._4_4_,local_3a0.order);
  local_300 = TVar14;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_328,&local_80);
  if (0 < (int)local_420) {
    CVar19 = R;
    iVar5 = (int)local_420;
    CVar6 = CStack_424;
    do {
      if (0 < (int)CVar6) {
        y = R;
        CVar23 = local_430._8_4_;
        do {
          if (0 < (int)CVar23) {
            CVar23 = R;
            do {
              local_378._4_4_ = y ^ CVar19 ^ CVar23;
              local_378._0_4_ = local_378._4_4_;
              CStack_36c = local_378._4_4_;
              local_378._8_4_ = local_378._4_4_;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_430,(IVec4 *)local_378,CVar23,y,CVar19);
              CVar23 = CVar23 + A;
            } while ((int)CVar23 < (int)local_430._8_4_);
            CVar6 = CStack_424;
            CVar23 = local_430._8_4_;
          }
          y = y + A;
        } while ((int)y < (int)CVar6);
        iVar5 = (int)local_420;
      }
      CVar19 = CVar19 + A;
    } while ((int)CVar19 < iVar5);
  }
  pMVar20 = local_3b8;
  getShaderGridSize((image *)local_378,local_3b8->m_imageType,local_3c0);
  local_37c = local_378._0_4_;
  if (RGB < (uint)local_378._0_4_) {
    local_37c = RGBA;
  }
  local_380 = UNORM_SHORT_565;
  if ((uint)local_378._4_4_ < UNORM_SHORT_565) {
    local_380 = local_378._4_4_;
  }
  local_384 = I;
  if ((uint)local_378._8_4_ < I) {
    local_384 = local_378._8_4_;
  }
  if (0 < local_328.m_size.m_data[2]) {
    local_3b0 = (TestContext *)((ulong)local_3b0 & 0xffffffff00000000);
    iVar5 = local_328.m_size.m_data[2];
    iVar7 = local_328.m_size.m_data[1];
    do {
      if (0 < iVar7) {
        local_3e8 = (VkQueue)((ulong)local_3e8 & 0xffffffff00000000);
        iVar18 = local_328.m_size.m_data[0];
        do {
          if (0 < iVar18) {
            x = 0;
            iVar5 = (uint)local_3e8 - (uint)local_3e8 % local_380;
            do {
              uVar16 = x % local_37c;
              lVar13 = 0;
              CVar19 = R;
              do {
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_378,(int)local_430,
                           (*(int *)((long)&image::(anonymous_namespace)::g_ShaderReadOffsetsX +
                                    lVar13) + x) % local_37c + (x - uVar16),
                           (*(int *)((long)&image::(anonymous_namespace)::g_ShaderReadOffsetsY +
                                    lVar13) + (uint)local_3e8) % local_380 + iVar5);
                CVar19 = CVar19 + local_378._0_4_;
                lVar13 = lVar13 + 4;
              } while (lVar13 != 0x10);
              local_378._4_4_ = CVar19;
              local_378._0_4_ = CVar19;
              CStack_36c = CVar19;
              local_378._8_4_ = CVar19;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_328,(IVec4 *)local_378,x,(uint)local_3e8,
                         (int)local_3b0);
              x = x + 1;
            } while ((int)x < local_328.m_size.m_data[0]);
            pMVar20 = local_3b8;
            iVar7 = local_328.m_size.m_data[1];
            iVar18 = local_328.m_size.m_data[0];
          }
          iVar17 = (uint)local_3e8 + 1;
          local_3e8 = (VkQueue)CONCAT44(local_3e8._4_4_,iVar17);
          iVar5 = local_328.m_size.m_data[2];
        } while (iVar17 < iVar7);
      }
      iVar18 = (int)local_3b0 + 1;
      local_3b0 = (TestContext *)CONCAT44(local_3b0._4_4_,iVar18);
    } while (iVar18 < iVar5);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1f8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1f8,&local_80);
  pTVar10 = local_2f0;
  local_328.m_format = local_1f8[0].m_format;
  local_328.m_size.m_data[2] = local_1f8[0].m_size.m_data[2];
  local_328.m_pitch.m_data[2] = local_1f8[0].m_pitch.m_data[2];
  local_328.m_data = local_1f8[0].m_data;
  local_3b0 = ((pMVar20->super_TestInstance).m_context)->m_testCtx;
  IVar1 = pMVar20->m_imageType;
  VVar8 = ::vk::mapTextureFormat(local_2f0);
  bVar2 = ::vk::isIntFormat(VVar8);
  local_3e8._0_1_ = true;
  if (!bVar2) {
    VVar8 = ::vk::mapTextureFormat(pTVar10);
    local_3e8._0_1_ = ::vk::isUintFormat(VVar8);
  }
  dVar3 = getNumLayers(IVar1,local_3c0);
  if (dVar3 == 0) {
    dVar3 = 0;
  }
  else {
    uVar24 = 0;
    dVar3 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
      std::ios_base::~ios_base(local_188);
      pTVar10 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)local_430,0,(char *)0x0,0xae9b29);
      local_378._0_8_ = &local_368;
      TVar14 = (TextureFormat)(pTVar10 + 2);
      if (*pTVar10 == TVar14) {
        local_368 = *(long *)TVar14;
        TStack_360 = pTVar10[3];
      }
      else {
        local_368 = *(long *)TVar14;
        local_378._0_8_ = *pTVar10;
      }
      unique0x00012000 = pTVar10[1];
      *pTVar10 = TVar14;
      pTVar10[1].order = R;
      pTVar10[1].type = SNORM_INT8;
      *(undefined1 *)&pTVar10[2].order = R;
      if ((long *)local_430._0_8_ != &local_420) {
        operator_delete((void *)local_430._0_8_,local_420 + 1);
      }
      local_3a8 = local_398;
      local_1f8[0].m_format.order = D;
      local_1f8[0].m_format.type = SNORM_INT8;
      local_3a8 = (TextureFormat *)std::__cxx11::string::_M_create(&local_3a8,(ulong)local_1f8);
      local_398[0] = local_1f8[0].m_format;
      *local_3a8 = (TextureFormat)0x6f43206567616d49;
      local_3a8[1] = (TextureFormat)0x6e6f73697261706d;
      *(undefined2 *)&local_3a8[2].order = 0x202c;
      local_3a0 = local_1f8[0].m_format;
      *(VkCommandBuffer_s *)((long)&local_3a8->order + (long)local_1f8[0].m_format) =
           (VkCommandBuffer_s)0x0;
      if (IVar1 - IMAGE_TYPE_CUBE < 2) {
        local_358 = local_348;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_358,local_3a8,
                   (VkCommandBuffer)((long)&local_3a8->order + (long)local_1f8[0].m_format));
        std::__cxx11::string::append((char *)&local_358);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
        std::ios_base::~ios_base(local_188);
        uVar22 = 0xf;
        if (local_358 != local_348) {
          uVar22 = local_348[0];
        }
        if (uVar22 < (ulong)(local_2c0 + local_350)) {
          uVar22 = 0xf;
          if (local_2c8 != local_2b8) {
            uVar22 = local_2b8[0];
          }
          if (uVar22 < (ulong)(local_2c0 + local_350)) goto LAB_00730aa1;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_358);
        }
        else {
LAB_00730aa1:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_2c8);
        }
        local_3e0 = &local_3d0;
        puVar15 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar15) {
          local_3d0 = *puVar15;
          uStack_3c8 = puVar11[3];
        }
        else {
          local_3d0 = *puVar15;
          local_3e0 = (ulong *)*puVar11;
        }
        local_3d8 = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)puVar15 = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_3e0);
        puVar15 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar15) {
          local_3f8 = *puVar15;
          lStack_3f0 = plVar12[3];
          local_408.m_data._0_8_ = &local_3f8;
        }
        else {
          local_3f8 = *puVar15;
          local_408.m_data._0_8_ = (ulong *)*plVar12;
        }
        local_408.m_data._8_8_ = plVar12[1];
        *plVar12 = (long)puVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
        std::ios_base::~ios_base(local_188);
        uVar22 = 0xf;
        if ((ulong *)local_408.m_data._0_8_ != &local_3f8) {
          uVar22 = local_3f8;
        }
        if (uVar22 < (ulong)(local_2e0 + local_408.m_data._8_8_)) {
          uVar22 = 0xf;
          if (local_2e8 != local_2d8) {
            uVar22 = local_2d8[0];
          }
          if (uVar22 < (ulong)(local_2e0 + local_408.m_data._8_8_)) goto LAB_00730db0;
          pTVar10 = (TextureFormat *)
                    std::__cxx11::string::replace
                              ((ulong)&local_2e8,0,(char *)0x0,local_408.m_data._0_8_);
        }
        else {
LAB_00730db0:
          pTVar10 = (TextureFormat *)
                    std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_2e8);
        }
        local_430._0_8_ = &local_420;
        TVar14 = (TextureFormat)(pTVar10 + 2);
        if (*pTVar10 == TVar14) {
          local_420 = *(long *)TVar14;
          TStack_418 = pTVar10[3];
        }
        else {
          local_420 = *(long *)TVar14;
          local_430._0_8_ = *pTVar10;
        }
        unique0x00012000 = pTVar10[1];
        *pTVar10 = TVar14;
        pTVar10[1].order = R;
        pTVar10[1].type = SNORM_INT8;
        *(undefined1 *)TVar14 = 0;
        std::__cxx11::string::operator=((string *)&local_3a8,(string *)local_430);
        if ((long *)local_430._0_8_ != &local_420) {
          operator_delete((void *)local_430._0_8_,local_420 + 1);
        }
        if (local_2e8 != local_2d8) {
          operator_delete(local_2e8,local_2d8[0] + 1);
        }
        if ((ulong *)local_408.m_data._0_8_ != &local_3f8) {
          operator_delete((void *)local_408.m_data._0_8_,local_3f8 + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0 + 1);
        }
        if (local_2c8 != local_2b8) {
          operator_delete(local_2c8,local_2b8[0] + 1);
        }
        if (local_358 != local_348) {
          operator_delete(local_358,local_348[0] + 1);
        }
      }
      else {
        local_408.m_data._0_8_ = &local_3f8;
        if (IVar1 == IMAGE_TYPE_3D) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_408,local_3a8,
                     (VkCommandBuffer)((long)&local_3a8->order + (long)local_1f8[0].m_format));
          std::__cxx11::string::append((char *)&local_408);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
          std::ios_base::~ios_base(local_188);
          uVar22 = 0xf;
          if ((ulong *)local_408.m_data._0_8_ != &local_3f8) {
            uVar22 = local_3f8;
          }
          if (uVar22 < (ulong)(local_3d8 + local_408.m_data._8_8_)) {
            uVar22 = 0xf;
            if (local_3e0 != &local_3d0) {
              uVar22 = local_3d0;
            }
            if ((ulong)(local_3d8 + local_408.m_data._8_8_) <= uVar22) {
              pTVar10 = (TextureFormat *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_3e0,0,(char *)0x0,local_408.m_data._0_8_);
              goto LAB_00730f18;
            }
          }
          pTVar10 = (TextureFormat *)
                    std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_3e0);
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_408,local_3a8,
                     (VkCommandBuffer)((long)&local_3a8->order + (long)local_1f8[0].m_format));
          std::__cxx11::string::append((char *)&local_408);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1f8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
          std::ios_base::~ios_base(local_188);
          uVar22 = 0xf;
          if ((ulong *)local_408.m_data._0_8_ != &local_3f8) {
            uVar22 = local_3f8;
          }
          if (uVar22 < (ulong)(local_3d8 + local_408.m_data._8_8_)) {
            uVar22 = 0xf;
            if (local_3e0 != &local_3d0) {
              uVar22 = local_3d0;
            }
            if ((ulong)(local_3d8 + local_408.m_data._8_8_) <= uVar22) {
              pTVar10 = (TextureFormat *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_3e0,0,(char *)0x0,local_408.m_data._0_8_);
              goto LAB_00730f18;
            }
          }
          pTVar10 = (TextureFormat *)
                    std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_3e0);
        }
LAB_00730f18:
        local_430._0_8_ = &local_420;
        TVar14 = (TextureFormat)(pTVar10 + 2);
        if (*pTVar10 == TVar14) {
          local_420 = *(long *)TVar14;
          TStack_418 = pTVar10[3];
        }
        else {
          local_420 = *(long *)TVar14;
          local_430._0_8_ = *pTVar10;
        }
        unique0x00012000 = pTVar10[1];
        *pTVar10 = TVar14;
        pTVar10[1].order = R;
        pTVar10[1].type = SNORM_INT8;
        *(undefined1 *)TVar14 = 0;
        std::__cxx11::string::operator=((string *)&local_3a8,(string *)local_430);
        if ((long *)local_430._0_8_ != &local_420) {
          operator_delete((void *)local_430._0_8_,local_420 + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0 + 1);
        }
        if ((ulong *)local_408.m_data._0_8_ != &local_3f8) {
          operator_delete((void *)local_408.m_data._0_8_,local_3f8 + 1);
        }
      }
      getLayerOrSlice(local_1f8,IVar1,&local_328,(deUint32)uVar24);
      getLayerOrSlice((ConstPixelBufferAccess *)local_430,IVar1,&local_58,(deUint32)uVar24);
      if ((char)local_3e8 == '\0') {
        local_408.m_data[2] = 0.01;
        local_408.m_data[3] = 0.01;
        local_408.m_data[0] = 0.01;
        local_408.m_data[1] = 0.01;
        bVar2 = tcu::floatThresholdCompare
                          (local_3b0->m_log,(char *)local_378._0_8_,(char *)local_3a8,local_1f8,
                           (ConstPixelBufferAccess *)local_430,&local_408,COMPARE_LOG_RESULT);
      }
      else {
        local_408.m_data[0] = 0.0;
        local_408.m_data[1] = 0.0;
        local_408.m_data[2] = 0.0;
        local_408.m_data[3] = 0.0;
        bVar2 = tcu::intThresholdCompare
                          (local_3b0->m_log,(char *)local_378._0_8_,(char *)local_3a8,local_1f8,
                           (ConstPixelBufferAccess *)local_430,(UVec4 *)&local_408,
                           COMPARE_LOG_RESULT);
      }
      if (local_3a8 != local_398) {
        operator_delete(local_3a8,(ulong)((long)local_398[0] + 1));
      }
      if ((long *)local_378._0_8_ != &local_368) {
        operator_delete((void *)local_378._0_8_,local_368 + 1);
      }
      dVar4 = getNumLayers(IVar1,local_3c0);
      dVar3 = dVar3 + bVar2;
      uVar24 = uVar24 + 1;
    } while (uVar24 < dVar4);
  }
  dVar4 = getNumLayers(IVar1,local_3c0);
  TVar14 = (TextureFormat)(local_1f8[0].m_size.m_data + 2);
  local_1f8[0].m_format = TVar14;
  if (dVar3 == dVar4) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"Passed","");
    pTVar21 = local_2f8;
    local_2f8->m_code = QP_TEST_RESULT_PASS;
    (local_2f8->m_description)._M_dataplus._M_p = (pointer)&(local_2f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8->m_description,local_1f8[0].m_format,
               (VkCommandBuffer)
               (CONCAT44(local_1f8[0].m_size.m_data[1],local_1f8[0].m_size.m_data[0]) +
               (long)local_1f8[0].m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"Image comparison failed","");
    pTVar21 = local_2f8;
    local_2f8->m_code = QP_TEST_RESULT_FAIL;
    (local_2f8->m_description)._M_dataplus._M_p = (pointer)&(local_2f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8->m_description,local_1f8[0].m_format,
               (VkCommandBuffer)
               (CONCAT44(local_1f8[0].m_size.m_data[1],local_1f8[0].m_size.m_data[0]) +
               (long)local_1f8[0].m_format));
  }
  if (local_1f8[0].m_format != TVar14) {
    operator_delete((void *)local_1f8[0].m_format,
                    CONCAT44(local_1f8[0].m_pitch.m_data[0],local_1f8[0].m_size.m_data[2]) + 1);
  }
  TVar14 = local_300;
  tcu::TextureLevel::~TextureLevel(&local_80);
  if (TVar14 != (TextureFormat)0x0) {
    local_1f8[0].m_format = TVar14;
    (**(code **)(*plStack_290 + 0x240))(plStack_290,local_288,uStack_280,1);
  }
  if (local_258 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_250,(VkCommandPool)local_258);
  }
  if (local_238 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_230,(VkPipeline)local_238);
  }
  if (local_278 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_270,(VkPipelineLayout)local_278);
  }
  if (local_218 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_210,(VkShaderModule)local_218);
  }
  return pTVar21;
}

Assistant:

tcu::TestStatus	MemoryQualifierInstanceBase::iterate (void)
{
	const VkDevice			device				= m_context.getDevice();
	const DeviceInterface&	deviceInterface		= m_context.getDeviceInterface();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const VkDeviceSize	bufferSizeInBytes = getNumPixels(m_imageType, m_imageSize) * tcu::getPixelSize(m_format);

	// Prepare resources for the test
	prepareResources(bufferSizeInBytes);

	// Prepare descriptor sets
	prepareDescriptors();

	// Create compute shader
	const vk::Unique<VkShaderModule> shaderModule(createShaderModule(deviceInterface, device, m_context.getBinaryCollection().get(m_name), 0u));

	// Create compute pipeline
	const vk::Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(deviceInterface, device, *m_descriptorSetLayout));
	const vk::Unique<VkPipeline> pipeline(makeComputePipeline(deviceInterface, device, *pipelineLayout, *shaderModule));

	// Create command buffer
	const Unique<VkCommandPool> cmdPool(createCommandPool(deviceInterface, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(deviceInterface, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(deviceInterface, *cmdBuffer);

	deviceInterface.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	deviceInterface.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);

	commandsBeforeCompute(*cmdBuffer, bufferSizeInBytes);

	const tcu::UVec3 numGroups = getNumWorkGroups(m_imageType, m_imageSize);
	deviceInterface.cmdDispatch(*cmdBuffer, numGroups.x(), numGroups.y(), numGroups.z());

	commandsAfterCompute(*cmdBuffer, bufferSizeInBytes);

	endCommandBuffer(deviceInterface, *cmdBuffer);

	// Submit and wait for completion
	submitCommandsAndWait(deviceInterface, device, queue, *cmdBuffer);

	// Retrieve data from buffer to host memory
	const Allocation& allocation = m_buffer->getAllocation();
	invalidateMappedMemoryRange(deviceInterface, device, allocation.getMemory(), allocation.getOffset(), bufferSizeInBytes);

	const tcu::UVec3 computeGridSize = getShaderGridSize(m_imageType, m_imageSize);
	tcu::ConstPixelBufferAccess resultPixelBuffer(m_format, computeGridSize.x(), computeGridSize.y(), computeGridSize.z(), allocation.getHostPtr());

	// Create a reference image
	tcu::TextureLevel referenceImage = generateReferenceImage();
	tcu::ConstPixelBufferAccess referencePixelBuffer = referenceImage.getAccess();

	// Validate the result
	if (comparePixelBuffers(m_context.getTestContext(), m_imageType, m_imageSize, m_format, referencePixelBuffer, resultPixelBuffer))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}